

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_api.h
# Opt level: O3

bool __thiscall benchmark::State::KeepRunning(State *this)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  
  cVar3 = this->started_;
  if ((bool)cVar3 == false) {
    ResumeTiming(this);
    this->started_ = true;
    cVar3 = '\x01';
  }
  uVar1 = this->total_iterations_;
  uVar2 = this->max_iterations;
  this->total_iterations_ = uVar1 + 1;
  if (uVar2 <= uVar1) {
    if (cVar3 == '\0') {
      __assert_fail("started_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/include/benchmark/benchmark_api.h"
                    ,0xec,"bool benchmark::State::KeepRunning()");
    }
    PauseTiming(this);
    this->total_iterations_ = this->max_iterations;
  }
  return uVar1 < uVar2;
}

Assistant:

bool KeepRunning() {
    if (BENCHMARK_BUILTIN_EXPECT(!started_, false)) {
        ResumeTiming();
        started_ = true;
    }
    bool const res = total_iterations_++ < max_iterations;
    if (BENCHMARK_BUILTIN_EXPECT(!res, false)) {
        assert(started_);
        PauseTiming();
        // Total iterations now is one greater than max iterations. Fix this.
        total_iterations_ = max_iterations;
    }
    return res;
  }